

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi.cpp
# Opt level: O0

void anon_unknown.dwarf_7315::RtMidiCustomErrorCallback(Type typ,string *errorText,void *userData)

{
  _Base_ptr p_Var1;
  bool bVar2;
  pointer ppVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  _Self local_38;
  _Self local_30;
  iterator it;
  RtMidi_callback_rec *rec;
  void *userData_local;
  string *errorText_local;
  Type typ_local;
  
  it._M_node = (_Base_ptr)userData;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::pair<RtMidi_*,_lua_State_*>,_int,_std::less<std::pair<RtMidi_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>_>
       ::find((map<std::pair<RtMidi_*,_lua_State_*>,_int,_std::less<std::pair<RtMidi_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>_>
               *)(anonymous_namespace)::RtMidi_callbacks,(key_type *)userData);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::pair<RtMidi_*,_lua_State_*>,_int,_std::less<std::pair<RtMidi_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>_>
       ::end((map<std::pair<RtMidi_*,_lua_State_*>,_int,_std::less<std::pair<RtMidi_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>_>
              *)(anonymous_namespace)::RtMidi_callbacks);
  bVar2 = std::operator==(&local_30,&local_38);
  if (bVar2) {
    std::operator<<((ostream *)&std::cerr,"RtMidi instance not found!\n");
  }
  p_Var1 = (it._M_node)->_M_parent;
  ppVar3 = std::_Rb_tree_iterator<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>::
           operator->(&local_30);
  lua_rawgeti(p_Var1,0xfff0b9d8,ppVar3->second);
  lua_pushinteger((it._M_node)->_M_parent,typ);
  p_Var1 = (it._M_node)->_M_parent;
  uVar4 = std::__cxx11::string::c_str();
  uVar5 = std::__cxx11::string::size();
  lua_pushlstring(p_Var1,uVar4,uVar5);
  lua_callk((it._M_node)->_M_parent,2,0,0,0);
  return;
}

Assistant:

void RtMidiCustomErrorCallback(RtMidiError::Type typ, const std::string &errorText, void *userData) {
	auto *rec = reinterpret_cast<RtMidi_callback_rec *>(userData);
	auto it = RtMidi_callbacks.find(*rec);
	if (it == RtMidi_callbacks.end())
		std::cerr << "RtMidi instance not found!\n";

//	if (it != RtMidi_callbacks.end()) {
		lua_rawgeti(rec->second, LUA_REGISTRYINDEX, it->second); // RtMidi_callbackwrapper
		lua_pushinteger(rec->second, typ);
		lua_pushlstring(rec->second, errorText.c_str(), errorText.size());
		lua_call(rec->second, 2, 0);
//	}
//	else {
//		std::cerr << "Function ref not found, falling back to RtMidiDefaultErrorCallback";
//		return RtMidiDefaultErrorCallback(typ, errorText, rec->second);
//	}
}